

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int execute_op(int a,int b,char operator)

{
  int iVar1;
  uint uVar2;
  undefined7 in_register_00000011;
  double dVar3;
  
  iVar1 = (int)CONCAT71(in_register_00000011,operator);
  switch(iVar1) {
  case 0x25:
    uVar2 = a % b;
    break;
  case 0x26:
    uVar2 = b & a;
    break;
  case 0x2a:
    uVar2 = b * a;
    break;
  case 0x2b:
    uVar2 = b + a;
    break;
  case 0x2d:
    uVar2 = a - b;
    break;
  case 0x2f:
    uVar2 = a / b;
    break;
  default:
    if (iVar1 == 0x3c) {
      return (uint)(a < b);
    }
    if (iVar1 == 0x3d) {
      return (uint)(a == b);
    }
    if (iVar1 == 0x3e) {
      return (uint)(b < a);
    }
    if (iVar1 == 0x5e) {
      dVar3 = pow((double)a,(double)b);
      return (int)dVar3;
    }
    if (iVar1 == 0x7c) {
      return b | a;
    }
    if (iVar1 == 0x7e) {
      return b ^ a;
    }
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2c:
  case 0x2e:
    uVar2 = 0;
    printf("Unknown operator: \'%c\'\n",(ulong)(uint)(int)operator);
  }
  return uVar2;
}

Assistant:

int execute_op(const int a, const int b, const char operator) {
  switch (operator) {
    case '+': return a + b;
    case '-': return a - b;
    case '*': return a * b;
    case '/': return a / b;
    case '%': return a % b;
    case '<': return a < b;
    case '>': return a > b;
    case '=': return a == b;
    case '^': return (int)(pow((double)a, (double)b));
    case '|': return a | b;
    case '&': return a & b;
    case '~': return a ^ b;
    default:
      printf("Unknown operator: '%c'\n", operator);
      return 0;
  }
}